

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

Result wabt::ReadAll(FILE *stream,char *name,
                    vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  size_t __n;
  Enum unaff_EBP;
  uint8_t buffer [4096];
  undefined1 local_1038 [4104];
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out_data,0);
  do {
    __n = fread(local_1038,1,0x1000,(FILE *)stream);
    if (__n == 0) {
      iVar3 = ferror((FILE *)stream);
      unaff_EBP = Ok;
      if (iVar3 != 0) {
        ReadAll();
        unaff_EBP = Error;
      }
    }
    else {
      puVar1 = (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      puVar2 = (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (out_data,(size_type)(puVar1 + (__n - (long)puVar2)));
      memcpy(puVar1 + ((long)(out_data->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start - (long)puVar2),local_1038,__n
            );
    }
  } while (__n != 0);
  return (Result)unaff_EBP;
}

Assistant:

static Result ReadAll(FILE* stream,
                      const char* name,
                      std::vector<uint8_t>* out_data) {
  out_data->resize(0);
  uint8_t buffer[4096];
  while (true) {
    size_t bytes_read = fread(buffer, 1, sizeof(buffer), stream);
    if (bytes_read == 0) {
      if (ferror(stream)) {
        fprintf(stderr, "error reading from %s: %s\n", name, strerror(errno));
        return Result::Error;
      }
      return Result::Ok;
    }
    size_t old_size = out_data->size();
    out_data->resize(old_size + bytes_read);
    memcpy(out_data->data() + old_size, buffer, bytes_read);
  }
}